

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

void __thiscall llvm::detail::DoubleAPFloat::DoubleAPFloat(DoubleAPFloat *this,DoubleAPFloat *RHS)

{
  Storage *rhs;
  APFloat *pAVar1;
  undefined8 *puVar2;
  APFloat *pAVar3;
  
  this->Semantics = RHS->Semantics;
  pAVar3 = (RHS->Floats)._M_t.
           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
           super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
  if (pAVar3 == (APFloat *)0x0) {
    pAVar3 = (APFloat *)0x0;
  }
  else {
    puVar2 = (undefined8 *)operator_new__(0x48);
    *puVar2 = 2;
    if ((pAVar3->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
      DoubleAPFloat((DoubleAPFloat *)(puVar2 + 2),(DoubleAPFloat *)&(pAVar3->U).IEEE);
    }
    else {
      IEEEFloat::IEEEFloat((IEEEFloat *)(puVar2 + 2),&(pAVar3->U).IEEE);
    }
    pAVar3 = (APFloat *)(puVar2 + 1);
    pAVar1 = (RHS->Floats)._M_t.
             super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
             super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
             super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
    rhs = &pAVar1[1].U;
    if (pAVar1[1].U.semantics == (fltSemantics *)semPPCDoubleDouble) {
      DoubleAPFloat((DoubleAPFloat *)(puVar2 + 6),(DoubleAPFloat *)&rhs->IEEE);
    }
    else {
      IEEEFloat::IEEEFloat((IEEEFloat *)(puVar2 + 6),&rhs->IEEE);
    }
  }
  (this->Floats)._M_t.super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
  _M_t.super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
  super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl = pAVar3;
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    return;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xf32,"llvm::detail::DoubleAPFloat::DoubleAPFloat(const DoubleAPFloat &)");
}

Assistant:

DoubleAPFloat::DoubleAPFloat(const DoubleAPFloat &RHS)
    : Semantics(RHS.Semantics),
      Floats(RHS.Floats ? new APFloat[2]{APFloat(RHS.Floats[0]),
                                         APFloat(RHS.Floats[1])}
                        : nullptr) {
  assert(Semantics == &semPPCDoubleDouble);
}